

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::Memory::Init(Memory *this,u32 dst_offset,DataSegment *src,u32 src_offset,u32 size)

{
  pointer puVar1;
  Enum EVar2;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  EVar2 = Error;
  if (((ulong)size + (ulong)dst_offset <=
       (ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) &&
     (src_offset <= src->size_ - size && size <= src->size_)) {
    EVar2 = Ok;
    if (size != 0) {
      memmove(puVar1 + dst_offset,
              (src->desc_->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start + src_offset,(ulong)size);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::Init(u32 dst_offset,
                    const DataSegment& src,
                    u32 src_offset,
                    u32 size) {
  if (IsValidAccess(dst_offset, 0, size) &&
      src.IsValidRange(src_offset, size)) {
    std::copy(src.desc().data.begin() + src_offset,
              src.desc().data.begin() + src_offset + size,
              data_.begin() + dst_offset);
    return Result::Ok;
  }
  return Result::Error;
}